

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy.h
# Opt level: O1

Contents __thiscall
snmalloc::
Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
::add_block(Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
            *this,Contents addr,size_t size)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *this_00;
  undefined8 uStack_828;
  RBPath local_820;
  
  while (bVar1 = remove_buddy(this,addr,size), bVar1) {
    addr = addr & size * -2;
    size = size * 2;
  }
  uVar3 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  lVar4 = -0xe;
  if (size != 1) {
    lVar4 = (uVar3 ^ 0xffffffffffffffc0) + 0x33;
  }
  uVar3 = lVar4 + 1U;
  if (lVar4 + 1U < this->empty_at_or_above) {
    uVar3 = this->empty_at_or_above;
  }
  this->empty_at_or_above = uVar3;
  lVar2 = 0;
  do {
    if (*(long *)((long)(this->entries)._M_elems[lVar4].cache + lVar2) == 0) {
      *(Contents *)((long)(this->entries)._M_elems[lVar4].cache + lVar2) = addr;
      return 0;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  lVar2 = 8;
  do {
    *(undefined8 *)((long)&uStack_828 + lVar2) = 0;
    *(undefined1 *)((long)&local_820.path._M_elems[0].node.ptr.val + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x808);
  this_00 = &(this->entries)._M_elems[lVar4].tree;
  local_820.path._M_elems[0].dir = false;
  local_820.length = 1;
  local_820.path._M_elems[0].node.ptr.val = (H)(H)this_00;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  ::find(this_00,&local_820,addr);
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  ::insert_path(this_00,&local_820,addr);
  return 0;
}

Assistant:

typename Rep::Contents add_block(typename Rep::Contents addr, size_t size)
    {
      validate_block(addr, size);

      if (remove_buddy(addr, size))
      {
        // Add to next level cache
        size *= 2;
        addr = Rep::align_down(addr, size);
        if (size == bits::one_at_bit(MAX_SIZE_BITS))
        {
          // Invariant should be checked on all non-tail return paths.
          // Holds trivially here with current design.
          invariant();
          // Too big for this buddy allocator.
          return addr;
        }
        return add_block(addr, size);
      }

      auto idx = to_index(size);
      empty_at_or_above = bits::max(empty_at_or_above, idx + 1);

      for (auto& e : entries[idx].cache)
      {
        if (Rep::equal(Rep::null, e))
        {
          e = addr;
          return Rep::null;
        }
      }

      auto path = entries[idx].tree.get_root_path();
      entries[idx].tree.find(path, addr);
      entries[idx].tree.insert_path(path, addr);
      invariant();
      return Rep::null;
    }